

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::SingleFieldGenerator::GeneratePropertyDeclaration
          (SingleFieldGenerator *this,Printer *printer)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  undefined8 uVar1;
  bool bVar2;
  Sub *local_1c8;
  basic_string_view<char,_std::char_traits<char>_> local_1a0;
  basic_string_view<char,_std::char_traits<char>_> local_188;
  basic_string_view<char,_std::char_traits<char>_> local_170;
  undefined1 local_159;
  anon_class_16_2_39a024bb_for_cb local_158 [2];
  allocator<char> local_131;
  string local_130;
  Sub *local_110;
  Sub local_108;
  iterator local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_40;
  undefined1 local_30 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  vars;
  Printer *printer_local;
  SingleFieldGenerator *this_local;
  
  vars.storage_.callback_buffer_._8_8_ = printer;
  SubstitutionMap::Install
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_30,&(this->super_FieldGenerator).variables_,printer);
  uVar1 = vars.storage_.callback_buffer_._8_8_;
  local_159 = 1;
  local_110 = &local_108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"comments",&local_131);
  local_158[0].printer = (Printer **)(vars.storage_.callback_buffer_ + 8);
  local_158[0].this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::objectivec::SingleFieldGenerator::GeneratePropertyDeclaration(google::protobuf::io::Printer*)const::__0>
            (&local_108,&local_130,local_158);
  local_159 = 0;
  local_50 = &local_108;
  local_48 = 1;
  v._M_len = 1;
  v._M_array = local_50;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_40._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_170,
             "\n                  $comments$\n                  @property(nonatomic, readwrite) $property_type$$name$$ deprecated_attribute$;\n                "
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit((Printer *)uVar1,local_40._M_allocated_capacity,local_40._8_8_,local_170._M_len,
                    local_170._M_str);
  local_1c8 = (Sub *)&local_50;
  do {
    local_1c8 = local_1c8 + -1;
    io::Printer::Sub::~Sub(local_1c8);
  } while (local_1c8 != &local_108);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  bVar2 = FieldGenerator::WantsHasProperty(&this->super_FieldGenerator);
  uVar1 = vars.storage_.callback_buffer_._8_8_;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_188,
               "\n      @property(nonatomic, readwrite) BOOL $hazzer_name$$ deprecated_attribute$;\n    "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)uVar1,local_188._M_len,local_188._M_str);
  }
  uVar1 = vars.storage_.callback_buffer_._8_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1a0,"\n");
  io::Printer::SourceLocation::current();
  io::Printer::Emit((Printer *)uVar1,local_1a0._M_len,local_1a0._M_str);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_30);
  return;
}

Assistant:

void SingleFieldGenerator::GeneratePropertyDeclaration(
    io::Printer* printer) const {
  auto vars = variables_.Install(printer);
  printer->Emit({{"comments",
                  [&] {
                    EmitCommentsString(printer, generation_options_,
                                       descriptor_);
                  }}},
                R"objc(
                  $comments$
                  @property(nonatomic, readwrite) $property_type$$name$$ deprecated_attribute$;
                )objc");
  if (WantsHasProperty()) {
    printer->Emit(R"objc(
      @property(nonatomic, readwrite) BOOL $hazzer_name$$ deprecated_attribute$;
    )objc");
  }
  printer->Emit("\n");
}